

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

result __thiscall
fmt::v6::detail::grisu_shortest_handler::on_digit
          (grisu_shortest_handler *this,char digit,uint64_t divisor,uint64_t remainder,
          uint64_t error,int exp,bool integral)

{
  int iVar1;
  result rVar2;
  ulong uVar3;
  long lVar4;
  double in_XMM0_Qa;
  
  iVar1 = this->size;
  this->size = iVar1 + 1;
  this->buf[iVar1] = digit;
  rVar2 = more;
  if (remainder < error) {
    lVar4 = 1;
    if (!integral) {
      lVar4 = (&basic_data<void>::powers_of_10_64)[-exp];
    }
    round(this,in_XMM0_Qa);
    uVar3 = (this->diff + 1) * lVar4;
    if (divisor <= error - remainder && (remainder <= uVar3 && uVar3 - remainder != 0)) {
      if (divisor + remainder < uVar3) {
        return error;
      }
      if ((divisor + remainder) - uVar3 < uVar3 - remainder) {
        return error;
      }
    }
    rVar2 = (error + lVar4 * -4 < remainder ||
            remainder <= (ulong)(lVar4 * 2) && lVar4 * 2 - remainder != 0) + done;
  }
  return rVar2;
}

Assistant:

digits::result on_digit(char digit, uint64_t divisor, uint64_t remainder,
                          uint64_t error, int exp, bool integral) {
    buf[size++] = digit;
    if (remainder >= error) return digits::more;
    uint64_t unit = integral ? 1 : data::powers_of_10_64[-exp];
    uint64_t up = (diff - 1) * unit;  // wp_Wup
    round(up, divisor, remainder, error);
    uint64_t down = (diff + 1) * unit;  // wp_Wdown
    if (remainder < down && error - remainder >= divisor &&
        (remainder + divisor < down ||
         down - remainder > remainder + divisor - down)) {
      return digits::error;
    }
    return 2 * unit <= remainder && remainder <= error - 4 * unit
               ? digits::done
               : digits::error;
  }